

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOut.c
# Opt level: O0

Vec_Int_t * Gia_ManGetStateAndCheckCex(Gia_Man_t *pAig,Abc_Cex_t *p,int iFrame)

{
  ulong uVar1;
  ulong uVar2;
  Abc_Cex_t *pAVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Gia_Obj_t *pGVar7;
  bool bVar8;
  int local_50;
  int local_4c;
  int iBit;
  int k;
  int i;
  int RetValue;
  Gia_Obj_t *pObjRo;
  Gia_Obj_t *pObjRi;
  Gia_Obj_t *pObj;
  Vec_Int_t *vInit;
  Abc_Cex_t *pAStack_18;
  int iFrame_local;
  Abc_Cex_t *p_local;
  Gia_Man_t *pAig_local;
  
  vInit._4_4_ = iFrame;
  pAStack_18 = p;
  p_local = (Abc_Cex_t *)pAig;
  iVar4 = Gia_ManRegNum(pAig);
  pObj = (Gia_Obj_t *)Vec_IntAlloc(iVar4);
  if ((vInit._4_4_ < 0) || (pAStack_18->iFrame < vInit._4_4_)) {
    __assert_fail("iFrame >= 0 && iFrame <= p->iFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOut.c"
                  ,0x100,"Vec_Int_t *Gia_ManGetStateAndCheckCex(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  Gia_ManCleanMark0((Gia_Man_t *)p_local);
  iBit = 0;
  while( true ) {
    iVar4 = Gia_ManRegNum((Gia_Man_t *)p_local);
    pAVar3 = p_local;
    bVar8 = false;
    if (iBit < iVar4) {
      iVar4 = Gia_ManPiNum((Gia_Man_t *)p_local);
      pObjRi = Gia_ManCi((Gia_Man_t *)pAVar3,iVar4 + iBit);
      bVar8 = pObjRi != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    *(ulong *)pObjRi = *(ulong *)pObjRi & 0xffffffffbfffffff;
    iBit = iBit + 1;
  }
  iBit = 0;
  local_50 = pAStack_18->nRegs;
  for (; iBit <= pAStack_18->iFrame; iBit = iBit + 1) {
    if (iBit == vInit._4_4_) {
      local_4c = 0;
      while( true ) {
        iVar4 = Gia_ManRegNum((Gia_Man_t *)p_local);
        pAVar3 = p_local;
        bVar8 = false;
        if (local_4c < iVar4) {
          iVar4 = Gia_ManPiNum((Gia_Man_t *)p_local);
          _i = Gia_ManCi((Gia_Man_t *)pAVar3,iVar4 + local_4c);
          bVar8 = _i != (Gia_Obj_t *)0x0;
        }
        if (!bVar8) break;
        Vec_IntPush((Vec_Int_t *)pObj,(uint)(*(ulong *)_i >> 0x1e) & 1);
        local_4c = local_4c + 1;
      }
    }
    local_4c = 0;
    while( true ) {
      iVar4 = Gia_ManPiNum((Gia_Man_t *)p_local);
      bVar8 = false;
      if (local_4c < iVar4) {
        pObjRi = Gia_ManCi((Gia_Man_t *)p_local,local_4c);
        bVar8 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      uVar6 = Abc_InfoHasBit((uint *)(pAStack_18 + 1),local_50);
      *(ulong *)pObjRi = *(ulong *)pObjRi & 0xffffffffbfffffff | ((ulong)uVar6 & 1) << 0x1e;
      local_4c = local_4c + 1;
      local_50 = local_50 + 1;
    }
    local_4c = 0;
    while( true ) {
      bVar8 = false;
      if (local_4c < p_local[1].iFrame) {
        pObjRi = Gia_ManObj((Gia_Man_t *)p_local,local_4c);
        bVar8 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      iVar4 = Gia_ObjIsAnd(pObjRi);
      if (iVar4 != 0) {
        pGVar7 = Gia_ObjFanin0(pObjRi);
        uVar2 = *(ulong *)pGVar7;
        uVar6 = Gia_ObjFaninC0(pObjRi);
        pGVar7 = Gia_ObjFanin1(pObjRi);
        uVar1 = *(ulong *)pGVar7;
        uVar5 = Gia_ObjFaninC1(pObjRi);
        *(ulong *)pObjRi =
             *(ulong *)pObjRi & 0xffffffffbfffffff |
             ((ulong)(((uint)(uVar2 >> 0x1e) & 1 ^ uVar6) & ((uint)(uVar1 >> 0x1e) & 1 ^ uVar5)) & 1
             ) << 0x1e;
      }
      local_4c = local_4c + 1;
    }
    local_4c = 0;
    while( true ) {
      iVar4 = Vec_IntSize(*(Vec_Int_t **)&p_local[3].nPis);
      bVar8 = false;
      if (local_4c < iVar4) {
        pObjRi = Gia_ManCo((Gia_Man_t *)p_local,local_4c);
        bVar8 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      pGVar7 = Gia_ObjFanin0(pObjRi);
      uVar2 = *(ulong *)pGVar7;
      uVar6 = Gia_ObjFaninC0(pObjRi);
      *(ulong *)pObjRi =
           *(ulong *)pObjRi & 0xffffffffbfffffff |
           ((ulong)((uint)(uVar2 >> 0x1e) & 1 ^ uVar6) & 1) << 0x1e;
      local_4c = local_4c + 1;
    }
    if (iBit == pAStack_18->iFrame) break;
    local_4c = 0;
    while( true ) {
      iVar4 = Gia_ManRegNum((Gia_Man_t *)p_local);
      pAVar3 = p_local;
      bVar8 = false;
      if (local_4c < iVar4) {
        iVar4 = Gia_ManPoNum((Gia_Man_t *)p_local);
        pObjRo = Gia_ManCo((Gia_Man_t *)pAVar3,iVar4 + local_4c);
        pAVar3 = p_local;
        bVar8 = false;
        if (pObjRo != (Gia_Obj_t *)0x0) {
          iVar4 = Gia_ManPiNum((Gia_Man_t *)p_local);
          _i = Gia_ManCi((Gia_Man_t *)pAVar3,iVar4 + local_4c);
          bVar8 = _i != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar8) break;
      *(ulong *)_i = *(ulong *)_i & 0xffffffffbfffffff |
                     (ulong)((uint)(*(ulong *)pObjRo >> 0x1e) & 1) << 0x1e;
      local_4c = local_4c + 1;
    }
  }
  if (local_50 != pAStack_18->nBits) {
    __assert_fail("iBit == p->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOut.c"
                  ,0x117,"Vec_Int_t *Gia_ManGetStateAndCheckCex(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  pGVar7 = Gia_ManPo((Gia_Man_t *)p_local,pAStack_18->iPo);
  if (((uint)(*(ulong *)pGVar7 >> 0x1e) & 1) != 1) {
    Vec_IntFreeP((Vec_Int_t **)&pObj);
  }
  Gia_ManCleanMark0((Gia_Man_t *)p_local);
  return (Vec_Int_t *)pObj;
}

Assistant:

Vec_Int_t * Gia_ManGetStateAndCheckCex( Gia_Man_t * pAig, Abc_Cex_t * p, int iFrame )
{
    Vec_Int_t * vInit = Vec_IntAlloc( Gia_ManRegNum(pAig) );
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int RetValue, i, k, iBit = 0;
    assert( iFrame >= 0 && iFrame <= p->iFrame );
    Gia_ManCleanMark0(pAig);
    Gia_ManForEachRo( pAig, pObj, i )
        pObj->fMark0 = 0;//Abc_InfoHasBit(p->pData, iBit++);
    for ( i = 0, iBit = p->nRegs; i <= p->iFrame; i++ )
    {
        if ( i == iFrame )
        {
            Gia_ManForEachRo( pAig, pObjRo, k )
                Vec_IntPush( vInit, pObjRo->fMark0 );
        }
        Gia_ManForEachPi( pAig, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
        Gia_ManForEachAnd( pAig, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( pAig, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        if ( i == p->iFrame )
            break;
        Gia_ManForEachRiRo( pAig, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
    }
    assert( iBit == p->nBits );
    RetValue = Gia_ManPo(pAig, p->iPo)->fMark0;
    if ( RetValue != 1 )
        Vec_IntFreeP( &vInit );
    Gia_ManCleanMark0(pAig);
    return vInit;
}